

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O2

ON_3dVector * __thiscall
ON_Quaternion::Rotate(ON_3dVector *__return_storage_ptr__,ON_Quaternion *this,ON_3dVector v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_Quaternion qinv;
  ON_Quaternion local_58;
  ON_Quaternion local_38;
  
  dVar1 = this->a;
  dVar2 = this->b;
  dVar3 = this->c;
  dVar4 = this->d;
  dVar5 = dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  dVar5 = (double)(-(ulong)(2.2250738585072014e-308 < dVar5) & (ulong)(1.0 / dVar5));
  ON_Quaternion(&local_38,dVar1 * dVar5,-dVar2 * dVar5,-dVar3 * dVar5,-dVar4 * dVar5);
  dVar1 = this->a;
  dVar2 = this->b;
  dVar3 = this->c;
  dVar4 = this->d;
  ON_Quaternion(&local_58,(-dVar2 * v.x - v.y * dVar3) - dVar4 * v.z,
                (dVar1 * v.x + dVar3 * v.z) - dVar4 * v.y,dVar4 * v.x + (dVar1 * v.y - v.z * dVar2),
                (dVar1 * v.z + dVar2 * v.y) - dVar3 * v.x);
  __return_storage_ptr__->z =
       local_58.d * local_38.a +
       ((local_38.c * local_58.b + local_58.a * local_38.d) - local_58.c * local_38.b);
  __return_storage_ptr__->x =
       -local_58.d * local_38.c +
       local_38.d * local_58.c + local_58.a * local_38.b + local_58.b * local_38.a;
  __return_storage_ptr__->y =
       local_58.d * local_38.b +
       local_38.a * local_58.c + local_58.a * local_38.c + -local_58.b * local_38.d;
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Quaternion::Rotate(ON_3dVector v) const
{
  // returns q*(0,v.x,v.y,v.z)*Inverse(q)
  double x = a*a + b*b + c*c + d*d;
  x = ( x > ON_DBL_MIN ) ? 1.0/x : 0.0;
  const ON_Quaternion qinv(a*x,-b*x,-c*x,-d*x);

  const ON_Quaternion qv( -b*v.x - c*v.y - d*v.z,
                           a*v.x + c*v.z - d*v.y,
                           a*v.y - b*v.z + d*v.x,
                           a*v.z + b*v.y - c*v.x);

  v.x = qv.a*qinv.b + qv.b*qinv.a + qv.c*qinv.d - qv.d*qinv.c;
  v.y = qv.a*qinv.c - qv.b*qinv.d + qv.c*qinv.a + qv.d*qinv.b;
  v.z = qv.a*qinv.d + qv.b*qinv.c - qv.c*qinv.b + qv.d*qinv.a;
  return v;
}